

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O2

ostream * glu::detail::operator<<(ostream *str,BooleanPointerFmt *fmt)

{
  ostream *poVar1;
  deUint32 ndx;
  ulong uVar2;
  Enum<int,_1UL> local_40;
  
  if (*(long *)fmt != 0) {
    std::operator<<(str,"{ ");
    for (uVar2 = 0; uVar2 < *(uint *)(fmt + 8); uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<(str,", ");
      }
      local_40.m_getName = getBooleanName;
      local_40.m_value = (int)*(byte *)(*(long *)fmt + uVar2);
      tcu::Format::Enum<int,_1UL>::toStream(&local_40,str);
    }
    std::operator<<(str," }");
    return str;
  }
  poVar1 = std::operator<<(str,"(null)");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const BooleanPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << getBooleanStr(fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}